

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall
header_inclusion_html_actions::module_start(header_inclusion_html_actions *this,string *module)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  <h2>From <a href=\"",0x14);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".html\"><em>",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(module->_M_dataplus)._M_p,module->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</em></a></h2><ul>\n",0x13);
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << "  <h2>From <a href=\"" << module << ".html\"><em>" << module << "</em></a></h2><ul>\n";
    }